

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<QList<bool_(*)(void_**)>_>::reallocate
          (QMovableArrayOps<QList<bool_(*)(void_**)>_> *this,qsizetype alloc,AllocationOption option
          )

{
  long lVar1;
  AllocationOption in_EDX;
  qsizetype in_RSI;
  QList<bool_(*)(void_**)> *in_RDI;
  long in_FS_OFFSET;
  pair<QTypedArrayData<QList<bool_(*)(void_**)>_>_*,_QList<bool_(*)(void_**)>_*> pVar2;
  pair<QTypedArrayData<QList<bool_(*)(void_**)>_>_*,_QList<bool_(*)(void_**)>_*> pair;
  QList<bool_(*)(void_**)> *local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pVar2 = QTypedArrayData<QList<bool_(*)(void_**)>_>::reallocateUnaligned
                    ((QTypedArrayData<QList<bool_(*)(void_**)>_> *)&DAT_aaaaaaaaaaaaaaaa,in_RDI,
                     in_RSI,in_EDX);
  local_10 = pVar2.second;
  if (local_10 == (QList<bool_(*)(void_**)> *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      qBadAlloc();
    }
  }
  else {
    (in_RDI->d).d = (Data *)pVar2.first;
    (in_RDI->d).ptr = (_func_bool_void_ptr_ptr **)local_10;
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void reallocate(qsizetype alloc, QArrayData::AllocationOption option)
    {
        auto pair = Data::reallocateUnaligned(this->d, this->ptr, alloc, option);
        Q_CHECK_PTR(pair.second);
        Q_ASSERT(pair.first != nullptr);
        this->d = pair.first;
        this->ptr = pair.second;
    }